

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

int lj_opt_fwd_href_nokey(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  AliasRet AVar3;
  IRIns *pIVar4;
  IRIns *store;
  IRRef ref;
  IRRef lim;
  jit_State *J_local;
  
  uVar2 = (uint)(J->fold).ins.field_0.op1;
  if ((((J->fold).right[0].field_1.t.irt & 0x1f) == 0xe) && (uVar2 < J->chain[0x3b])) {
    uVar1 = J->chain[0x4a];
    while (store._0_4_ = (uint)uVar1, uVar2 < (uint)store) {
      if ((uint)store < J->chain[0x3b]) {
        return 0;
      }
      uVar1 = *(ushort *)((long)(J->cur).ir + (ulong)(uint)store * 8 + 6);
    }
  }
  uVar1 = J->chain[0x4b];
  while( true ) {
    store._0_4_ = (uint)uVar1;
    if ((uint)store <= uVar2) {
      return 1;
    }
    pIVar4 = (J->cur).ir + (uint)store;
    AVar3 = aa_ahref(J,&(J->fold).ins,(J->cur).ir + (pIVar4->field_0).op1);
    if (AVar3 != ALIAS_NO) break;
    uVar1 = (pIVar4->field_0).prev;
  }
  return 0;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_href_nokey(jit_State *J)
{
  IRRef lim = fins->op1;  /* Search limit. */
  IRRef ref;

  /* The key for an ASTORE may end up in the hash part after a NEWREF. */
  if (irt_isnum(fright->t) && J->chain[IR_NEWREF] > lim) {
    ref = J->chain[IR_ASTORE];
    while (ref > lim) {
      if (ref < J->chain[IR_NEWREF])
	return 0;  /* Conflict. */
      ref = IR(ref)->prev;
    }
  }

  /* Search for conflicting stores. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    if (aa_ahref(J, fins, IR(store->op1)) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = store->prev;
  }

  return 1;  /* No conflict. Can fold to niltv. */
}